

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

hostent * gethostbyname(char *__name)

{
  bool bVar1;
  char *name_local;
  
  if (g_sys_gethostbyname_func == (gethostbyname_pfn_t)0x0) {
    g_sys_gethostbyname_func = (gethostbyname_pfn_t)dlsym(0xffffffffffffffff,"gethostbyname");
  }
  bVar1 = co_is_enable_sys_hook();
  if (bVar1) {
    name_local = (char *)co_gethostbyname(__name);
  }
  else {
    name_local = (char *)(*g_sys_gethostbyname_func)(__name);
  }
  return (hostent *)name_local;
}

Assistant:

struct hostent *gethostbyname(const char *name)
{
	HOOK_SYS_FUNC( gethostbyname );

#if defined( __APPLE__ ) || defined( __FreeBSD__ )
	return g_sys_gethostbyname_func( name );
#else
	if (!co_is_enable_sys_hook())
	{
		return g_sys_gethostbyname_func(name);
	}
	return co_gethostbyname(name);
#endif

}